

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp.cpp
# Opt level: O1

MPP_RET __thiscall Mpp::get_packet_async(Mpp *this,MppPacket *packet)

{
  MppPollType MVar1;
  pthread_mutex_t *__mutex;
  pthread_mutex_t *ppVar2;
  RK_S32 RVar3;
  __pid_t _Var4;
  MPP_RET MVar5;
  MppPacket pkt;
  MppPacket local_30;
  
  __mutex = (pthread_mutex_t *)this->mPktOut;
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_lock(__mutex);
  }
  *packet = (MppPacket)0x0;
  RVar3 = mpp_list::list_size(this->mPktOut);
  if (RVar3 == 0) {
    MVar1 = this->mOutputTimeout;
    if ((void *)(ulong)(uint)MVar1 == (void *)0x0) {
      usleep(1000);
    }
    else {
      ppVar2 = (pthread_mutex_t *)this->mPktOut;
      if (MVar1 < MPP_POLL_NON_BLOCK) {
        pthread_cond_wait((pthread_cond_t *)(ppVar2 + 1),ppVar2);
      }
      else {
        _Var4 = MppMutexCond::wait((MppMutexCond *)&ppVar2->__data,(void *)(ulong)(uint)MVar1);
        if (_Var4 != 0) {
          MVar5 = -(uint)(_Var4 != 0x6e) | MPP_ERR_TIMEOUT;
          goto LAB_001390b5;
        }
      }
    }
  }
  RVar3 = mpp_list::list_size(this->mPktOut);
  if (RVar3 == 0) {
    ppVar2 = (pthread_mutex_t *)this->mFrmIn;
    if (ppVar2 != (pthread_mutex_t *)0x0) {
      pthread_mutex_lock(ppVar2);
    }
    RVar3 = mpp_list::list_size(this->mFrmIn);
    if (RVar3 != 0) {
      notify(this,1);
    }
    MVar5 = MPP_NOK;
    if (ppVar2 != (pthread_mutex_t *)0x0) {
      pthread_mutex_unlock(ppVar2);
    }
  }
  else {
    local_30 = (MppPacket)0x0;
    mpp_list::del_at_head(this->mPktOut,&local_30,8);
    this->mPacketGetCount = this->mPacketGetCount + 1;
    notify(this,2);
    *packet = local_30;
    mpp_buffer_sync_partial_begin_f
              (*(MppBuffer *)((long)local_30 + 0x40),1,
               *(int *)((long)local_30 + 0x10) - *(int *)((long)local_30 + 8),
               *(RK_U32 *)((long)local_30 + 0x20),"get_packet_async");
    MVar5 = MPP_OK;
  }
LAB_001390b5:
  if (__mutex != (pthread_mutex_t *)0x0) {
    pthread_mutex_unlock(__mutex);
  }
  return MVar5;
}

Assistant:

MPP_RET Mpp::get_packet_async(MppPacket *packet)
{
    AutoMutex autoPacketLock(mPktOut->mutex());

    *packet = NULL;
    if (0 == mPktOut->list_size()) {
        if (mOutputTimeout) {
            if (mOutputTimeout < 0) {
                /* block wait */
                mPktOut->wait();
            } else {
                RK_S32 ret = mPktOut->wait(mOutputTimeout);
                if (ret) {
                    if (ret == ETIMEDOUT)
                        return MPP_ERR_TIMEOUT;
                    else
                        return MPP_NOK;
                }
            }
        } else {
            /* NOTE: in non-block mode the sleep is to avoid user's dead loop */
            msleep(1);
        }
    }

    if (mPktOut->list_size()) {
        MppPacket pkt = NULL;
        MppPacketImpl *impl = NULL;
        RK_U32 offset;

        mPktOut->del_at_head(&pkt, sizeof(pkt));
        mPacketGetCount++;
        notify(MPP_OUTPUT_DEQUEUE);

        *packet = pkt;

        impl = (MppPacketImpl *)pkt;
        offset = (RK_U32)((char *)impl->pos - (char *)impl->data);
        mpp_buffer_sync_ro_partial_begin(impl->buffer, offset, impl->length);
    } else {
        AutoMutex autoFrameLock(mFrmIn->mutex());

        if (mFrmIn->list_size())
            notify(MPP_INPUT_ENQUEUE);

        return MPP_NOK;
    }

    return MPP_OK;
}